

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O1

int math_min(lua_State *L)

{
  int iVar1;
  int narg;
  bool bVar2;
  lua_Number n;
  lua_Number lVar3;
  
  iVar1 = lua_gettop(L);
  n = luaL_checknumber(L,1);
  if (1 < iVar1) {
    lVar3 = n;
    narg = 2;
    do {
      n = luaL_checknumber(L,narg);
      if (lVar3 <= n) {
        n = lVar3;
      }
      bVar2 = narg != iVar1;
      lVar3 = n;
      narg = narg + 1;
    } while (bVar2);
  }
  lua_pushnumber(L,n);
  return 1;
}

Assistant:

static int math_min (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  lua_Number dmin = luaL_checknumber(L, 1);
  int i;
  for (i=2; i<=n; i++) {
    lua_Number d = luaL_checknumber(L, i);
    if (d < dmin)
      dmin = d;
  }
  lua_pushnumber(L, dmin);
  return 1;
}